

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_handle.hpp
# Opt level: O2

EvictionQueue * __thiscall
duckdb::BufferPool::GetEvictionQueueForBlockHandle(BufferPool *this,BlockHandle *handle)

{
  ulong uVar1;
  long lVar2;
  reference this_00;
  type pEVar3;
  FileBufferType queue_buffer_type;
  ulong uVar4;
  long lVar5;
  
  lVar2 = 0;
  for (uVar4 = 1; (uVar4 != 4 && (handle->buffer_type != uVar4)); uVar4 = uVar4 + 1) {
    lVar2 = lVar2 + (this->eviction_queue_sizes)._M_elems[uVar4 - 1];
  }
  uVar4 = (handle->eviction_queue_idx).super___atomic_base<unsigned_long>._M_i;
  uVar1 = (this->eviction_queue_sizes)._M_elems[(ulong)handle->buffer_type - 1];
  lVar5 = 0;
  if (uVar4 < uVar1) {
    lVar5 = ~uVar4 + uVar1;
  }
  this_00 = vector<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_true>
            ::get<true>(&this->queues,lVar5 + lVar2);
  pEVar3 = unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>::
           operator*(this_00);
  return pEVar3;
}

Assistant:

FileBufferType GetBufferType() const {
		return buffer_type;
	}